

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

uint64_t __thiscall Path::lastModifiedMs(Path *this)

{
  int iVar1;
  uint64_t uVar2;
  stat st;
  stat local_90;
  
  iVar1 = ::stat((this->super_String).mString._M_dataplus._M_p,&local_90);
  if (iVar1 == -1) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)local_90.st_mtim.tv_nsec / 1000000 + local_90.st_mtim.tv_sec * 1000;
  }
  return uVar2;
}

Assistant:

uint64_t Path::lastModifiedMs() const
{
    bool ok;
    struct stat st = stat(&ok);
    if (!ok)
        return 0;

#ifdef HAVE_STATMTIM
    return st.st_mtim.tv_sec * static_cast<uint64_t>(1000) + st.st_mtim.tv_nsec / static_cast<uint64_t>(1000000);
#else
    return st.st_mtime * static_cast<uint64_t>(1000);
#endif
}